

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O3

bool __thiscall SimpleString::containsNoCase(SimpleString *this,SimpleString *other)

{
  char *pcVar1;
  SimpleString local_30;
  SimpleString local_20;
  
  lowerCase(&local_30);
  lowerCase(&local_20);
  pcVar1 = StrStr(local_30.buffer_,local_20.buffer_);
  deallocateInternalBuffer(&local_20);
  deallocateInternalBuffer(&local_30);
  return pcVar1 != (char *)0x0;
}

Assistant:

bool SimpleString::containsNoCase(const SimpleString& other) const
{
    return lowerCase().contains(other.lowerCase());
}